

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

EGLConfig __thiscall deqp::egl::Image::ImageFormatCase::getConfig(ImageFormatCase *this)

{
  Library *egl;
  EGLConfig pvVar1;
  EGLint attribList [15];
  EGLint local_58 [18];
  
  local_58[0xc] = 0x3025;
  local_58[0xd] = 8;
  local_58[0xe] = 0x3038;
  local_58[8] = 0x3023;
  local_58[9] = 8;
  local_58[10] = 0x3021;
  local_58[0xb] = 8;
  local_58[4] = 0x3024;
  local_58[5] = 8;
  local_58[6] = 0x3022;
  local_58[7] = 8;
  local_58[0] = 0x3040;
  local_58[1] = 4;
  local_58[2] = 0x3033;
  local_58[3] = 4;
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar1 = eglu::chooseSingleConfig(egl,this->m_display,local_58);
  return pvVar1;
}

Assistant:

EGLConfig ImageFormatCase::getConfig (void)
{
	const EGLint attribList[] =
	{
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
		EGL_RED_SIZE,			8,
		EGL_BLUE_SIZE,			8,
		EGL_GREEN_SIZE,			8,
		EGL_ALPHA_SIZE,			8,
		EGL_DEPTH_SIZE,			8,
		EGL_NONE
	};

	return eglu::chooseSingleConfig(m_eglTestCtx.getLibrary(), m_display, attribList);
}